

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::isExtensionSupported
               (Context *context,string *extensionName)

{
  bool bVar1;
  int iVar2;
  ContextType ctxType;
  NotSupportedError *pNVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar2 = std::__cxx11::string::compare((char *)extensionName);
  if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)extensionName), iVar2 != 0)) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (context->m_contextInfo,(extensionName->_M_dataplus)._M_p);
    if (bVar1) {
      return;
    }
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Extension ","");
    std::operator+(&local_68,&local_88,extensionName);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8," not supported.","");
    std::operator+(&local_48,&local_68,&local_a8);
    tcu::NotSupportedError::NotSupportedError
              (pNVar3,local_48._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
               ,0x4a);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ctxType.super_ApiType.m_bits = (ApiType)(*context->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar1) &&
     (bVar1 = glu::ContextInfo::isExtensionSupported
                        (context->m_contextInfo,(extensionName->_M_dataplus)._M_p), !bVar1)) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Extension ","");
    std::operator+(&local_68,&local_88,extensionName);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8," not supported.","");
    std::operator+(&local_48,&local_68,&local_a8);
    tcu::NotSupportedError::NotSupportedError
              (pNVar3,local_48._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
               ,0x47);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void isExtensionSupported (Context& context, std::string extensionName)
{
	if (extensionName == "GL_EXT_draw_buffers_indexed" || extensionName == "GL_KHR_blend_equation_advanced")
	{
		if (!contextSupports(context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !context.getContextInfo().isExtensionSupported(extensionName.c_str()))
			TCU_THROW(NotSupportedError, (std::string("Extension ") + extensionName + std::string(" not supported.")).c_str());
	}
	else if (!context.getContextInfo().isExtensionSupported(extensionName.c_str()))
		TCU_THROW(NotSupportedError, (std::string("Extension ") + extensionName + std::string(" not supported.")).c_str());
}